

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O3

IGUIEditBox * __thiscall
irr::gui::CGUIEnvironment::addEditBox
          (CGUIEnvironment *this,wchar_t *text,rect<int> *rectangle,bool border,IGUIElement *parent,
          s32 id)

{
  int *piVar1;
  long lVar2;
  CGUIEditBox *this_00;
  IGUIElement *parent_00;
  
  this_00 = (CGUIEditBox *)operator_new(0x220);
  parent_00 = (IGUIElement *)&(this->super_IGUIEnvironment).field_0x8;
  if (parent != (IGUIElement *)0x0) {
    parent_00 = parent;
  }
  CGUIEditBox::CGUIEditBox(this_00,text,border,&this->super_IGUIEnvironment,parent_00,id,rectangle);
  lVar2 = *(long *)(*(long *)this_00 + -0x18);
  piVar1 = (int *)(&this_00->field_0x10 + lVar2);
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    (**(code **)(*(long *)(&this_00->field_0x0 + lVar2) + 8))();
  }
  return (IGUIEditBox *)this_00;
}

Assistant:

IGUIEditBox *CGUIEnvironment::addEditBox(const wchar_t *text,
		const core::rect<s32> &rectangle, bool border,
		IGUIElement *parent, s32 id)
{
	IGUIEditBox *d = new CGUIEditBox(text, border, this,
			parent ? parent : this, id, rectangle);

	d->drop();
	return d;
}